

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderIntegerMixTests.cpp
# Opt level: O2

qpTestResult __thiscall deqp::ShaderIntegerMixDefineCase::test(ShaderIntegerMixDefineCase *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  undefined4 uVar4;
  qpTestResult qVar5;
  undefined4 extraout_var;
  mapped_type *pmVar7;
  long lVar8;
  allocator<char> local_c5;
  GLSLVersion local_c4;
  string code;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  GLint compileSuccess;
  char *strings [1];
  long lVar6;
  
  iVar3 = (*((this->super_ShaderIntegerMixCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  bVar1 = glu::glslVersionIsES((this->super_ShaderIntegerMixCase).m_glslVersion);
  local_c4 = GLSL_VERSION_330;
  if (bVar1) {
    local_c4 = GLSL_VERSION_300_ES;
  }
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_ShaderIntegerMixCase).super_TestCase.m_context)->m_contextInfo,
                     "GL_EXT_shader_integer_mix");
  if (bVar1) {
    bVar2 = 1;
    for (lVar8 = 0; lVar8 != 0x20; lVar8 = lVar8 + 0x10) {
      args._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      args._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      args._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &args._M_t._M_impl.super__Rb_tree_header._M_header;
      args._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      args._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           args._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      glu::getGLSLVersionDeclaration(local_c4);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&code,"VERSION_DECL",(allocator<char> *)strings);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&args,&code);
      std::__cxx11::string::assign((char *)pmVar7);
      std::__cxx11::string::~string((string *)&code);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&code,"BODY",(allocator<char> *)strings);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&args,&code);
      std::__cxx11::string::assign((char *)pmVar7);
      std::__cxx11::string::~string((string *)&code);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&compileSuccess,
                 "${VERSION_DECL}\n#extension GL_EXT_shader_integer_mix: require\n\n#if !defined GL_EXT_shader_integer_mix\n#  error GL_EXT_shader_integer_mix is not defined\n#elif GL_EXT_shader_integer_mix != 1\n#  error GL_EXT_shader_integer_mix is not equal to 1\n#endif\n\nvoid main(void) { ${BODY} }\n"
                 ,&local_c5);
      tcu::StringTemplate::StringTemplate((StringTemplate *)strings,(string *)&compileSuccess);
      tcu::StringTemplate::specialize(&code,(StringTemplate *)strings,&args);
      tcu::StringTemplate::~StringTemplate((StringTemplate *)strings);
      std::__cxx11::string::~string((string *)&compileSuccess);
      uVar4 = (**(code **)(lVar6 + 0x3f0))
                        (*(undefined4 *)((long)&test::shader_targets[0].target + lVar8));
      strings[0] = code._M_dataplus._M_p;
      (**(code **)(lVar6 + 0x12b8))(uVar4,1,(allocator<char> *)strings,0);
      (**(code **)(lVar6 + 0x248))(uVar4);
      compileSuccess = 0;
      (**(code **)(lVar6 + 0xa70))(uVar4,0x8b81,(string *)&compileSuccess);
      (**(code **)(lVar6 + 0x470))(uVar4);
      if (compileSuccess == 0) {
        bVar2 = 0;
      }
      std::__cxx11::string::~string((string *)&code);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&args._M_t);
    }
    qVar5 = (qpTestResult)(~bVar2 & 1);
  }
  else {
    qVar5 = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  return qVar5;
}

Assistant:

virtual qpTestResult test()
	{
		const glw::Functions& gl   = m_context.getRenderContext().getFunctions();
		bool				  pass = true;

		static const char source_template[] = "${VERSION_DECL}\n"
											  "#extension GL_EXT_shader_integer_mix: require\n"
											  "\n"
											  "#if !defined GL_EXT_shader_integer_mix\n"
											  "#  error GL_EXT_shader_integer_mix is not defined\n"
											  "#elif GL_EXT_shader_integer_mix != 1\n"
											  "#  error GL_EXT_shader_integer_mix is not equal to 1\n"
											  "#endif\n"
											  "\n"
											  "void main(void) { ${BODY} }\n";

		static const struct
		{
			GLenum		target;
			const char* body;
		} shader_targets[] = {
			{ GL_VERTEX_SHADER, "gl_Position = vec4(0);" }, { GL_FRAGMENT_SHADER, "" },
		};

		const glu::GLSLVersion v = glslVersionIsES(m_glslVersion) ? glu::GLSL_VERSION_300_ES : glu::GLSL_VERSION_330;

		if (!m_context.getContextInfo().isExtensionSupported("GL_EXT_shader_integer_mix"))
			return QP_TEST_RESULT_NOT_SUPPORTED;

		for (int i = 0; i < DE_LENGTH_OF_ARRAY(shader_targets); i++)
		{
			std::map<std::string, std::string> args;

			args["VERSION_DECL"] = glu::getGLSLVersionDeclaration(v);
			args["BODY"]		 = shader_targets[i].body;

			std::string code = tcu::StringTemplate(source_template).specialize(args);

			GLuint		shader	 = gl.createShader(shader_targets[i].target);
			char const* strings[1] = { code.c_str() };
			gl.shaderSource(shader, 1, strings, 0);
			gl.compileShader(shader);

			GLint compileSuccess = 0;
			gl.getShaderiv(shader, GL_COMPILE_STATUS, &compileSuccess);
			gl.deleteShader(shader);

			if (!compileSuccess)
				pass = false;
		}

		return pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL;
	}